

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePaddingLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  bool bVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  Result *_result;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    this_00 = &__return_storage_ptr__->m_message;
    std::__cxx11::string::~string((string *)this_00);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)this_00);
      if (this->ndArrayInterpretation == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"Padding",(allocator<char> *)&err);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,layer,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"Padding",(allocator<char> *)&local_c0);
        validateRankCount(__return_storage_ptr__,layer,&err,2,-1,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&err);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      if (layer->_oneof_case_[0] == 200) {
        puVar3 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar3 = Specification::_PaddingLayerParams_default_instance_;
      }
      puVar2 = (undefined1 *)(((ActivationParams *)puVar3)->NonlinearityType_).linear_;
      if ((ActivationLinear *)puVar2 == (ActivationLinear *)0x0) {
        puVar2 = Specification::_BorderAmounts_default_instance_;
      }
      if (((((ActivationLinear *)puVar2)->_cached_size_).size_.super___atomic_base<int>._M_i &
          0xfffffffdU) == 0) {
        if (((PaddingLayerParams *)puVar3)->_oneof_case_[0] != 0) {
          Result::Result(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        std::operator+(&local_c0,"Padding layer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&err,&local_c0," padding type is not set.");
        std::__cxx11::string::~string((string *)&local_c0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      else {
        std::operator+(&local_40,"Padding layer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&local_80,&local_40," specifies ");
        puVar3 = (undefined1 *)(((ActivationParams *)puVar3)->NonlinearityType_).linear_;
        if ((ActivationLinear *)puVar3 == (ActivationLinear *)0x0) {
          puVar3 = Specification::_BorderAmounts_default_instance_;
        }
        std::__cxx11::to_string
                  (&local_a0,
                   (((ActivationLinear *)puVar3)->_cached_size_).size_.super___atomic_base<int>._M_i
                  );
        std::operator+(&local_c0,&local_80,&local_a0);
        std::operator+(&err,&local_c0,
                       " padding amounts but it must either specify 2 (for x and y axes), or 0 for the default values."
                      );
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_40);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      std::__cxx11::string::~string((string *)&err);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePaddingLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Padding", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Padding", 2, -1, blobNameToRank));
    }

    const auto& params = layer.padding();
    if (!(params.paddingamounts().borderamounts_size() == 0
          || params.paddingamounts().borderamounts_size() == 2)) {
        std::string err = "Padding layer " + layer.name() + " specifies " + std::to_string(params.paddingamounts().borderamounts_size()) + " padding amounts but it must either specify 2 (for x and y axes), or 0 for the default values.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (params.PaddingType_case() == Specification::PaddingLayerParams::PaddingTypeCase::PADDINGTYPE_NOT_SET) {
        std::string err = "Padding layer " + layer.name() + " padding type is not set.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}